

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O0

IPGMContext * __thiscall
r_exec::IPGMContext::getChild(IPGMContext *__return_storage_ptr__,IPGMContext *this,uint16_t index)

{
  Code *object;
  View *view;
  bool bVar1;
  Code **ppCVar2;
  reference ppVVar3;
  Atom *code;
  _Node_iterator_base<r_code::View_*,_true> local_78;
  _Node_iterator_base<r_code::View_*,_true> local_70;
  _Node_iterator_base<r_code::View_*,_true> local_68;
  _Node_iterator_base<r_code::View_*,_true> local_60;
  const_iterator v;
  undefined1 auStack_50 [6];
  uint16_t i_1;
  iterator local_40;
  undefined1 local_30 [8];
  const_iterator m;
  uint16_t i;
  uint16_t index_local;
  IPGMContext *this_local;
  
  m._list._6_2_ = index;
  switch((this->super__Context).data) {
  case STEM:
    IPGMContext(__return_storage_ptr__,this->object,this->view,(this->super__Context).code,
                (this->super__Context).index + index,
                (InputLessPGMOverlay *)(this->super__Context).overlay,STEM);
    break;
  case REFERENCE:
    IPGMContext(__return_storage_ptr__,this->object,this->view,(this->super__Context).code,
                (this->super__Context).index + index,
                (InputLessPGMOverlay *)(this->super__Context).overlay,REFERENCE);
    break;
  case VIEW:
    IPGMContext(__return_storage_ptr__,this->object,this->view,(this->super__Context).code,
                (this->super__Context).index + index,(InputLessPGMOverlay *)0x0,VIEW);
    break;
  case MKS:
    m._list._4_2_ = 0;
    r_code::list<r_code::Code_*>::const_iterator::const_iterator((const_iterator *)local_30);
    (*(this->object->super__Object)._vptr__Object[0x13])();
    local_40 = r_code::list<r_code::Code_*>::begin(&this->object->markers);
    r_code::list<r_code::Code_*>::const_iterator::operator=((const_iterator *)local_30,&local_40);
    while ((int)(uint)m._list._4_2_ < (int)(m._list._6_2_ - 1)) {
      _auStack_50 = r_code::list<r_code::Code_*>::end(&this->object->markers);
      bVar1 = r_code::list<r_code::Code_*>::_iterator::operator==
                        ((_iterator *)local_30,(_iterator *)auStack_50);
      if (bVar1) {
        (*(this->object->super__Object)._vptr__Object[0x14])();
        IPGMContext(__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      m._list._4_2_ = m._list._4_2_ + 1;
      r_code::list<r_code::Code_*>::const_iterator::operator++((const_iterator *)local_30);
    }
    (*(this->object->super__Object)._vptr__Object[0x14])();
    ppCVar2 = r_code::list<r_code::Code_*>::const_iterator::operator*((const_iterator *)local_30);
    IPGMContext(__return_storage_ptr__,*ppCVar2,0);
    break;
  case VWS:
    v.super__Node_iterator_base<r_code::View_*,_true>._M_cur._6_2_ = 0;
    std::__detail::_Node_const_iterator<r_code::View_*,_true,_true>::_Node_const_iterator
              ((_Node_const_iterator<r_code::View_*,_true,_true> *)&local_60);
    (*(this->object->super__Object)._vptr__Object[0x11])();
    local_70._M_cur =
         (__node_type *)
         std::
         unordered_set<r_code::View_*,_r_code::View::Hash,_r_code::View::Equal,_std::allocator<r_code::View_*>_>
         ::begin(&this->object->views);
    std::__detail::_Node_const_iterator<r_code::View_*,_true,_true>::_Node_const_iterator
              ((_Node_const_iterator<r_code::View_*,_true,_true> *)&local_68,
               (_Node_iterator<r_code::View_*,_true,_true> *)&local_70);
    local_60._M_cur = local_68._M_cur;
    while ((int)(uint)v.super__Node_iterator_base<r_code::View_*,_true>._M_cur._6_2_ <
           (int)(m._list._6_2_ - 1)) {
      local_78._M_cur =
           (__node_type *)
           std::
           unordered_set<r_code::View_*,_r_code::View::Hash,_r_code::View::Equal,_std::allocator<r_code::View_*>_>
           ::end(&this->object->views);
      bVar1 = std::__detail::operator==(&local_60,&local_78);
      if (bVar1) {
        (*(this->object->super__Object)._vptr__Object[0x12])();
        IPGMContext(__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      v.super__Node_iterator_base<r_code::View_*,_true>._M_cur._6_2_ =
           v.super__Node_iterator_base<r_code::View_*,_true>._M_cur._6_2_ + 1;
      std::__detail::_Node_const_iterator<r_code::View_*,_true,_true>::operator++
                ((_Node_const_iterator<r_code::View_*,_true,_true> *)&local_60);
    }
    (*(this->object->super__Object)._vptr__Object[0x12])();
    object = this->object;
    ppVVar3 = std::__detail::_Node_const_iterator<r_code::View_*,_true,_true>::operator*
                        ((_Node_const_iterator<r_code::View_*,_true,_true> *)&local_60);
    view = (View *)*ppVVar3;
    ppVVar3 = std::__detail::_Node_const_iterator<r_code::View_*,_true,_true>::operator*
                        ((_Node_const_iterator<r_code::View_*,_true,_true> *)&local_60);
    code = r_code::View::code(*ppVVar3,0);
    IPGMContext(__return_storage_ptr__,object,view,code,(this->super__Context).index + m._list._6_2_
                ,(InputLessPGMOverlay *)0x0,VIEW);
    break;
  case VALUE_ARRAY:
    IPGMContext(__return_storage_ptr__,this->object,this->view,(this->super__Context).code,
                (this->super__Context).index + index,
                (InputLessPGMOverlay *)(this->super__Context).overlay,VALUE_ARRAY);
    break;
  default:
    IPGMContext(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

IPGMContext getChild(uint16_t index) const
    {
        switch (data) {
        case STEM:
            return IPGMContext(object, view, code, this->index + index, (InputLessPGMOverlay *)overlay, STEM);

        case REFERENCE:
            return IPGMContext(object, view, code, this->index + index, (InputLessPGMOverlay *)overlay, REFERENCE);

        case VIEW:
            return IPGMContext(object, view, code, this->index + index, NULL, VIEW);

        case MKS: {
            uint16_t i = 0;
            r_code::list<Code *>::const_iterator m;
            object->acq_markers();

            for (m = object->markers.begin(); i < index - 1; ++i, ++m) {
                if (m == object->markers.end()) { // happens when the list has changed after the call to getChildrenCount.
                    object->rel_markers();
                    return IPGMContext();
                }
            }

            object->rel_markers();
            return IPGMContext(*m, 0);
        }

        case VWS: {
            uint16_t i = 0;
            std::unordered_set<r_code::View *, r_code::View::Hash, r_code::View::Equal>::const_iterator v;
            object->acq_views();

            for (v = object->views.begin(); i < index - 1; ++i, ++v) {
                if (v == object->views.end()) { // happens when the list has changed after the call to getChildrenCount.
                    object->rel_views();
                    return IPGMContext();
                }
            }

            object->rel_views();
            return IPGMContext(object, (r_exec::View*)*v, &(*v)->code(0), this->index + index, NULL, VIEW);
        }

        case VALUE_ARRAY:
            return IPGMContext(object, view, code, this->index + index, (InputLessPGMOverlay *)overlay, VALUE_ARRAY);

        default: // undefined context.
            return IPGMContext();
        }
    }